

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArchiveWrite.cxx
# Opt level: O3

void __thiscall
cmArchiveWrite::cmArchiveWrite
          (cmArchiveWrite *this,ostream *os,Compress c,string *format,int compressionLevel,
          int numThreads)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  archive *paVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  _Alloc_hider _Var11;
  uint uVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_03;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_04;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_05;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_06;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_07;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_08;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_09;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_12;
  string archiveFilterName;
  string source_date_epoch;
  string sNumThreads;
  string local_130;
  string local_110;
  string *local_f0;
  basic_string_view<char,_std::char_traits<char>_> local_e8;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  string local_a0;
  long *local_80 [2];
  long local_70 [2];
  string *local_60;
  string *local_58;
  string local_50;
  
  this->Stream = os;
  paVar7 = archive_write_new();
  this->Archive = paVar7;
  paVar7 = archive_read_disk_new();
  this->Disk = paVar7;
  this->Verbose = false;
  local_60 = &this->Format;
  local_a8 = &(this->Format).field_2;
  (this->Format)._M_dataplus._M_p = (pointer)local_a8;
  pcVar3 = (format->_M_dataplus)._M_p;
  local_58 = format;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar3,pcVar3 + format->_M_string_length);
  local_b0 = &(this->Error).field_2;
  (this->Error)._M_dataplus._M_p = (pointer)local_b0;
  (this->Error)._M_string_length = 0;
  (this->Error).field_2._M_local_buf[0] = '\0';
  local_b8 = &(this->MTime).field_2;
  (this->MTime)._M_dataplus._M_p = (pointer)local_b8;
  (this->MTime)._M_string_length = 0;
  (this->MTime).field_2._M_local_buf[0] = '\0';
  (this->Uid).IsValueSet = false;
  (this->Gid).IsValueSet = false;
  local_c0 = &(this->Uname).field_2;
  (this->Uname)._M_dataplus._M_p = (pointer)local_c0;
  (this->Uname)._M_string_length = 0;
  (this->Uname).field_2._M_local_buf[0] = '\0';
  local_c8 = &(this->Gname).field_2;
  (this->Gname)._M_dataplus._M_p = (pointer)local_c8;
  (this->Gname)._M_string_length = 0;
  (this->Gname).field_2._M_local_buf[0] = '\0';
  (this->Permissions).IsValueSet = false;
  (this->PermissionsMask).IsValueSet = false;
  if (numThreads < 1) {
    uVar12 = 0x7fffffff;
    if (numThreads != 0) {
      uVar12 = -numThreads;
    }
    uVar5 = std::thread::hardware_concurrency();
    if (uVar5 <= uVar12) {
      uVar12 = uVar5;
    }
    numThreads = 1;
    if (0 < (int)uVar5) {
      numThreads = uVar12;
    }
  }
  uVar12 = -numThreads;
  if (0 < numThreads) {
    uVar12 = numThreads;
  }
  uVar5 = 1;
  if (9 < uVar12) {
    uVar9 = (ulong)uVar12;
    uVar4 = 4;
    do {
      uVar5 = uVar4;
      uVar8 = (uint)uVar9;
      if (uVar8 < 100) {
        uVar5 = uVar5 - 2;
        goto LAB_0011bb4d;
      }
      if (uVar8 < 1000) {
        uVar5 = uVar5 - 1;
        goto LAB_0011bb4d;
      }
      if (uVar8 < 10000) goto LAB_0011bb4d;
      uVar9 = uVar9 / 10000;
      uVar4 = uVar5 + 4;
    } while (99999 < uVar8);
    uVar5 = uVar5 + 1;
  }
LAB_0011bb4d:
  local_f0 = (string *)&this->Error;
  local_80[0] = local_70;
  std::__cxx11::string::_M_construct((ulong)local_80,(char)uVar5 - (char)(numThreads >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_80[0] + (ulong)((uint)numThreads >> 0x1f)),uVar5,uVar12);
  switch(c) {
  case CompressNone:
    iVar6 = archive_write_add_filter_none(this->Archive);
    if (iVar6 == 0) goto switchD_0011bba9_default;
    cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
    local_e8._M_len = 0x1f;
    local_e8._M_str = "archive_write_add_filter_none: ";
    local_d8 = local_130._M_string_length;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_130._M_dataplus._M_p;
    views._M_len = 2;
    views._M_array = &local_e8;
    cmCatViews_abi_cxx11_(&local_110,views);
    break;
  case CompressCompress:
    iVar6 = archive_write_add_filter_compress(this->Archive);
    if (iVar6 == 0) goto switchD_0011bba9_default;
    cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
    local_e8._M_len = 0x23;
    local_e8._M_str = "archive_write_add_filter_compress: ";
    local_d8 = local_130._M_string_length;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_130._M_dataplus._M_p;
    views_03._M_len = 2;
    views_03._M_array = &local_e8;
    cmCatViews_abi_cxx11_(&local_110,views_03);
    break;
  case CompressGZip:
    iVar6 = archive_write_add_filter_gzip(this->Archive);
    if (iVar6 != 0) {
      cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
      local_e8._M_len = 0x1f;
      local_e8._M_str = "archive_write_add_filter_gzip: ";
      local_d8 = local_130._M_string_length;
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_130._M_dataplus._M_p;
      views_01._M_len = 2;
      views_01._M_array = &local_e8;
      cmCatViews_abi_cxx11_(&local_110,views_01);
      break;
    }
    paVar1 = &local_110.field_2;
    local_110._M_string_length = 0;
    local_110.field_2._M_local_buf[0] = '\0';
    local_110._M_dataplus._M_p = (pointer)paVar1;
    cmsys::SystemTools::GetEnv("SOURCE_DATE_EPOCH",&local_110);
    if ((local_110._M_string_length == 0) ||
       (iVar6 = archive_write_set_filter_option(this->Archive,"gzip","timestamp",(char *)0x0),
       iVar6 == 0)) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
      goto switchD_0011bba9_default;
    }
    cm_archive_error_string_abi_cxx11_(&local_a0,this->Archive);
    local_e8._M_len = 0x21;
    local_e8._M_str = "archive_write_set_filter_option: ";
    local_d8 = local_a0._M_string_length;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_a0._M_dataplus._M_p;
    views_06._M_len = 2;
    views_06._M_array = &local_e8;
    cmCatViews_abi_cxx11_(&local_130,views_06);
    std::__cxx11::string::operator=(local_f0,(string *)&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                               local_130.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p == paVar1) goto LAB_0011c39f;
LAB_0011c206:
    lVar10 = CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                      local_110.field_2._M_local_buf[0]);
    _Var11._M_p = local_110._M_dataplus._M_p;
    goto LAB_0011c397;
  case CompressBZip2:
    iVar6 = archive_write_add_filter_bzip2(this->Archive);
    if (iVar6 == 0) goto switchD_0011bba9_default;
    cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
    local_e8._M_len = 0x20;
    local_e8._M_str = "archive_write_add_filter_bzip2: ";
    local_d8 = local_130._M_string_length;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_130._M_dataplus._M_p;
    views_02._M_len = 2;
    views_02._M_array = &local_e8;
    cmCatViews_abi_cxx11_(&local_110,views_02);
    break;
  case CompressLZMA:
    iVar6 = archive_write_add_filter_lzma(this->Archive);
    if (iVar6 == 0) goto switchD_0011bba9_default;
    cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
    local_e8._M_len = 0x1f;
    local_e8._M_str = "archive_write_add_filter_lzma: ";
    local_d8 = local_130._M_string_length;
    local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_130._M_dataplus._M_p;
    views_00._M_len = 2;
    views_00._M_array = &local_e8;
    cmCatViews_abi_cxx11_(&local_110,views_00);
    break;
  case CompressXZ:
    iVar6 = archive_write_add_filter_xz(this->Archive);
    if (iVar6 == 0) {
      iVar6 = archive_write_set_filter_option(this->Archive,"xz","threads",(char *)local_80[0]);
      if (iVar6 == 0) goto switchD_0011bba9_default;
      cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
      local_e8._M_len = 0x1f;
      local_e8._M_str = "archive_compressor_xz_options: ";
      local_d8 = local_130._M_string_length;
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_130._M_dataplus._M_p;
      views_07._M_len = 2;
      views_07._M_array = &local_e8;
      cmCatViews_abi_cxx11_(&local_110,views_07);
    }
    else {
      cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
      local_e8._M_len = 0x1d;
      local_e8._M_str = "archive_write_add_filter_xz: ";
      local_d8 = local_130._M_string_length;
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_130._M_dataplus._M_p;
      views_04._M_len = 2;
      views_04._M_array = &local_e8;
      cmCatViews_abi_cxx11_(&local_110,views_04);
    }
    break;
  case CompressZstd:
    iVar6 = archive_write_add_filter_zstd(this->Archive);
    if (iVar6 == 0) {
      iVar6 = archive_write_set_filter_option(this->Archive,"zstd","threads",(char *)local_80[0]);
      if (iVar6 == 0) goto switchD_0011bba9_default;
      cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
      local_e8._M_len = 0x21;
      local_e8._M_str = "archive_compressor_zstd_options: ";
      local_d8 = local_130._M_string_length;
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_130._M_dataplus._M_p;
      views_08._M_len = 2;
      views_08._M_array = &local_e8;
      cmCatViews_abi_cxx11_(&local_110,views_08);
    }
    else {
      cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
      local_e8._M_len = 0x1f;
      local_e8._M_str = "archive_write_add_filter_zstd: ";
      local_d8 = local_130._M_string_length;
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_130._M_dataplus._M_p;
      views_05._M_len = 2;
      views_05._M_array = &local_e8;
      cmCatViews_abi_cxx11_(&local_110,views_05);
    }
    break;
  default:
switchD_0011bba9_default:
    if (compressionLevel != 0) {
      uVar12 = -compressionLevel;
      if (0 < compressionLevel) {
        uVar12 = compressionLevel;
      }
      uVar5 = 1;
      if (9 < uVar12) {
        uVar9 = (ulong)uVar12;
        uVar4 = 4;
        do {
          uVar5 = uVar4;
          uVar8 = (uint)uVar9;
          if (uVar8 < 100) {
            uVar5 = uVar5 - 2;
            goto LAB_0011c08e;
          }
          if (uVar8 < 1000) {
            uVar5 = uVar5 - 1;
            goto LAB_0011c08e;
          }
          if (uVar8 < 10000) goto LAB_0011c08e;
          uVar9 = uVar9 / 10000;
          uVar4 = uVar5 + 4;
        } while (99999 < uVar8);
        uVar5 = uVar5 + 1;
      }
LAB_0011c08e:
      paVar1 = &local_110.field_2;
      local_110._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct
                ((ulong)&local_110,(char)uVar5 - (char)(compressionLevel >> 0x1f));
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_110._M_dataplus._M_p + ((uint)compressionLevel >> 0x1f),uVar5,uVar12);
      paVar2 = &local_130.field_2;
      local_130._M_string_length = 0;
      local_130.field_2._M_local_buf[0] = '\0';
      local_130._M_dataplus._M_p = (pointer)paVar2;
      if (c - CompressGZip < 5) {
        std::__cxx11::string::_M_replace
                  ((ulong)&local_130,0,(char *)0x0,
                   (ulong)(&DAT_0025df7c + *(int *)(&DAT_0025df7c + (ulong)(c - CompressGZip) * 4)))
        ;
        if ((local_130._M_string_length != 0) &&
           (iVar6 = archive_write_set_filter_option
                              (this->Archive,local_130._M_dataplus._M_p,"compression-level",
                               local_110._M_dataplus._M_p), iVar6 != 0)) {
          cm_archive_error_string_abi_cxx11_(&local_50,this->Archive);
          local_e8._M_len = 0x21;
          local_e8._M_str = "archive_write_set_filter_option: ";
          local_d8 = local_50._M_string_length;
          local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_50._M_dataplus._M_p;
          views_09._M_len = 2;
          views_09._M_array = &local_e8;
          cmCatViews_abi_cxx11_(&local_a0,views_09);
          std::__cxx11::string::operator=(local_f0,(string *)&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != paVar2) {
            operator_delete(local_130._M_dataplus._M_p,
                            CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                     local_130.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_110._M_dataplus._M_p == paVar1) goto LAB_0011c39f;
          goto LAB_0011c206;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar2) {
          operator_delete(local_130._M_dataplus._M_p,
                          CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                                   local_130.field_2._M_local_buf[0]) + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,
                        CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                                 local_110.field_2._M_local_buf[0]) + 1);
      }
    }
    iVar6 = archive_read_disk_set_standard_lookup(this->Disk);
    if (iVar6 == 0) {
      iVar6 = archive_write_set_format_by_name(this->Archive,(local_58->_M_dataplus)._M_p);
      if (iVar6 == 0) {
        iVar6 = archive_write_set_bytes_in_last_block(this->Archive,1);
        if (iVar6 == 0) goto LAB_0011c39f;
        cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
        local_e8._M_len = 0x27;
        local_e8._M_str = "archive_write_set_bytes_in_last_block: ";
        local_d8 = local_130._M_string_length;
        local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_130._M_dataplus._M_p;
        views_12._M_len = 2;
        views_12._M_array = &local_e8;
        cmCatViews_abi_cxx11_(&local_110,views_12);
      }
      else {
        cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
        local_e8._M_len = 0x22;
        local_e8._M_str = "archive_write_set_format_by_name: ";
        local_d8 = local_130._M_string_length;
        local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_130._M_dataplus._M_p;
        views_11._M_len = 2;
        views_11._M_array = &local_e8;
        cmCatViews_abi_cxx11_(&local_110,views_11);
      }
    }
    else {
      cm_archive_error_string_abi_cxx11_(&local_130,this->Archive);
      local_e8._M_len = 0x27;
      local_e8._M_str = "archive_read_disk_set_standard_lookup: ";
      local_d8 = local_130._M_string_length;
      local_d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_130._M_dataplus._M_p;
      views_10._M_len = 2;
      views_10._M_array = &local_e8;
      cmCatViews_abi_cxx11_(&local_110,views_10);
    }
  }
  std::__cxx11::string::operator=(local_f0,(string *)&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT71(local_110.field_2._M_allocated_capacity._1_7_,
                             local_110.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    lVar10 = CONCAT71(local_130.field_2._M_allocated_capacity._1_7_,
                      local_130.field_2._M_local_buf[0]);
    _Var11._M_p = local_130._M_dataplus._M_p;
LAB_0011c397:
    operator_delete(_Var11._M_p,lVar10 + 1);
  }
LAB_0011c39f:
  if (local_80[0] != local_70) {
    operator_delete(local_80[0],local_70[0] + 1);
  }
  return;
}

Assistant:

cmArchiveWrite::cmArchiveWrite(std::ostream& os, Compress c,
                               std::string const& format, int compressionLevel,
                               int numThreads)
  : Stream(os)
  , Archive(archive_write_new())
  , Disk(archive_read_disk_new())
  , Format(format)
{
  // Upstream fixed an issue with their integer parsing in 3.4.0
  // which would cause spurious errors to be raised from `strtoull`.

  if (numThreads < 1) {
    int upperLimit = (numThreads == 0) ? std::numeric_limits<int>::max()
                                       : std::abs(numThreads);

    numThreads =
      cm::clamp<int>(std::thread::hardware_concurrency(), 1, upperLimit);
  }

  std::string sNumThreads = std::to_string(numThreads);

  switch (c) {
    case CompressNone:
      if (archive_write_add_filter_none(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_none: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressCompress:
      if (archive_write_add_filter_compress(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_compress: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressGZip: {
      if (archive_write_add_filter_gzip(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_gzip: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      std::string source_date_epoch;
      cmSystemTools::GetEnv("SOURCE_DATE_EPOCH", source_date_epoch);
      if (!source_date_epoch.empty()) {
        // We're not able to specify an arbitrary timestamp for gzip.
        // The next best thing is to omit the timestamp entirely.
        if (archive_write_set_filter_option(this->Archive, "gzip", "timestamp",
                                            nullptr) != ARCHIVE_OK) {
          this->Error = cmStrCat("archive_write_set_filter_option: ",
                                 cm_archive_error_string(this->Archive));
          return;
        }
      }
    } break;
    case CompressBZip2:
      if (archive_write_add_filter_bzip2(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_bzip2: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressLZMA:
      if (archive_write_add_filter_lzma(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_lzma: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
      break;
    case CompressXZ:
      if (archive_write_add_filter_xz(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_xz: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3004000

#  ifdef _AIX
      // FIXME: Using more than 2 threads creates an empty archive.
      // Enforce this limit pending further investigation.
      if (numThreads > 2) {
        numThreads = 2;
        sNumThreads = std::to_string(numThreads);
      }
#  endif
      if (archive_write_set_filter_option(this->Archive, "xz", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_xz_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif

      break;
    case CompressZstd:
      if (archive_write_add_filter_zstd(this->Archive) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_add_filter_zstd: ",
                               cm_archive_error_string(this->Archive));
        return;
      }

#if ARCHIVE_VERSION_NUMBER >= 3006000
      if (archive_write_set_filter_option(this->Archive, "zstd", "threads",
                                          sNumThreads.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_compressor_zstd_options: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
#endif
      break;
  }

  if (compressionLevel != 0) {
    std::string compressionLevelStr = std::to_string(compressionLevel);
    std::string archiveFilterName;
    switch (c) {
      case CompressNone:
      case CompressCompress:
        break;
      case CompressGZip:
        archiveFilterName = "gzip";
        break;
      case CompressBZip2:
        archiveFilterName = "bzip2";
        break;
      case CompressLZMA:
        archiveFilterName = "lzma";
        break;
      case CompressXZ:
        archiveFilterName = "xz";
        break;
      case CompressZstd:
        archiveFilterName = "zstd";
        break;
    }
    if (!archiveFilterName.empty()) {
      if (archive_write_set_filter_option(
            this->Archive, archiveFilterName.c_str(), "compression-level",
            compressionLevelStr.c_str()) != ARCHIVE_OK) {
        this->Error = cmStrCat("archive_write_set_filter_option: ",
                               cm_archive_error_string(this->Archive));
        return;
      }
    }
  }

#if !defined(_WIN32) || defined(__CYGWIN__)
  if (archive_read_disk_set_standard_lookup(this->Disk) != ARCHIVE_OK) {
    this->Error = cmStrCat("archive_read_disk_set_standard_lookup: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
#endif

  if (archive_write_set_format_by_name(this->Archive, format.c_str()) !=
      ARCHIVE_OK) {
    this->Error = cmStrCat("archive_write_set_format_by_name: ",
                           cm_archive_error_string(this->Archive));
    return;
  }

  // do not pad the last block!!
  if (archive_write_set_bytes_in_last_block(this->Archive, 1)) {
    this->Error = cmStrCat("archive_write_set_bytes_in_last_block: ",
                           cm_archive_error_string(this->Archive));
    return;
  }
}